

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

void j2k_dump_image_header(opj_image_t *img_header,OPJ_BOOL dev_dump_flag,FILE *out_stream)

{
  undefined8 in_RAX;
  undefined8 in_R9;
  long lVar1;
  ulong uVar2;
  char tab [2];
  undefined8 uVar3;
  
  if (dev_dump_flag == 0) {
    fwrite("Image info {\n",0xd,1,(FILE *)out_stream);
    uVar3 = CONCAT26(9,(int6)in_RAX);
  }
  else {
    fwrite("[DEV] Dump an image_header struct {\n",0x24,1,_stdout);
    uVar3 = CONCAT17((char)((ulong)in_RAX >> 0x38),(uint7)(uint6)in_RAX);
  }
  fprintf((FILE *)out_stream,"%s x0=%d, y0=%d\n",&stack0xffffffffffffffce,(ulong)img_header->x0,
          (ulong)img_header->y0,in_R9,uVar3);
  fprintf((FILE *)out_stream,"%s x1=%d, y1=%d\n",&stack0xffffffffffffffce,(ulong)img_header->x1,
          (ulong)img_header->y1);
  fprintf((FILE *)out_stream,"%s numcomps=%d\n",&stack0xffffffffffffffce,(ulong)img_header->numcomps
         );
  if ((img_header->comps != (opj_image_comp_t *)0x0) && (img_header->numcomps != 0)) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      fprintf((FILE *)out_stream,"%s\t component %d {\n",&stack0xffffffffffffffce,uVar2 & 0xffffffff
             );
      j2k_dump_image_comp_header
                ((opj_image_comp_t *)((long)&img_header->comps->dx + lVar1),dev_dump_flag,out_stream
                );
      fprintf((FILE *)out_stream,"%s}\n",&stack0xffffffffffffffce);
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x40;
    } while (uVar2 < img_header->numcomps);
  }
  fwrite("}\n",2,1,(FILE *)out_stream);
  return;
}

Assistant:

void j2k_dump_image_header(opj_image_t* img_header, OPJ_BOOL dev_dump_flag,
                           FILE* out_stream)
{
    char tab[2];

    if (dev_dump_flag) {
        fprintf(stdout, "[DEV] Dump an image_header struct {\n");
        tab[0] = '\0';
    } else {
        fprintf(out_stream, "Image info {\n");
        tab[0] = '\t';
        tab[1] = '\0';
    }

    fprintf(out_stream, "%s x0=%d, y0=%d\n", tab, img_header->x0, img_header->y0);
    fprintf(out_stream,     "%s x1=%d, y1=%d\n", tab, img_header->x1,
            img_header->y1);
    fprintf(out_stream, "%s numcomps=%d\n", tab, img_header->numcomps);

    if (img_header->comps) {
        OPJ_UINT32 compno;
        for (compno = 0; compno < img_header->numcomps; compno++) {
            fprintf(out_stream, "%s\t component %d {\n", tab, compno);
            j2k_dump_image_comp_header(&(img_header->comps[compno]), dev_dump_flag,
                                       out_stream);
            fprintf(out_stream, "%s}\n", tab);
        }
    }

    fprintf(out_stream, "}\n");
}